

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ValidateFileOptions
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  string *element_name;
  bool bVar1;
  FileDescriptor *pFVar2;
  int index;
  long lVar3;
  int i;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(file + 0x2c); lVar4 = lVar4 + 1) {
    ValidateMessageOptions
              (this,(Descriptor *)(*(long *)(file + 0x68) + lVar3),
               (DescriptorProto *)
               ((proto->message_type_).super_RepeatedPtrFieldBase.rep_)->elements[lVar4]);
    lVar3 = lVar3 + 0x90;
  }
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(file + 0x30); lVar4 = lVar4 + 1) {
    ValidateEnumOptions(this,(EnumDescriptor *)(*(long *)(file + 0x70) + lVar3),
                        (EnumDescriptorProto *)
                        ((proto->enum_type_).super_RepeatedPtrFieldBase.rep_)->elements[lVar4]);
    lVar3 = lVar3 + 0x50;
  }
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(file + 0x34); lVar4 = lVar4 + 1) {
    ValidateServiceOptions
              (this,(ServiceDescriptor *)(*(long *)(file + 0x78) + lVar3),
               (ServiceDescriptorProto *)
               ((proto->service_).super_RepeatedPtrFieldBase.rep_)->elements[lVar4]);
    lVar3 = lVar3 + 0x30;
  }
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(file + 0x38); lVar4 = lVar4 + 1) {
    ValidateFieldOptions
              (this,(FieldDescriptor *)(*(long *)(file + 0x80) + lVar3),
               (FieldDescriptorProto *)
               ((proto->extension_).super_RepeatedPtrFieldBase.rep_)->elements[lVar4]);
    lVar3 = lVar3 + 0x98;
  }
  bVar1 = IsLite(file);
  if (!bVar1) {
    for (index = 0; index < *(int *)(file + 0x20); index = index + 1) {
      pFVar2 = FileDescriptor::dependency(file,index);
      bVar1 = IsLite(pFVar2);
      if (bVar1) {
        pFVar2 = FileDescriptor::dependency(file,index);
        element_name = *(string **)pFVar2;
        pFVar2 = FileDescriptor::dependency(file,index);
        std::operator+(&local_50,
                       "Files that do not use optimize_for = LITE_RUNTIME cannot import files which do use this option.  This file is not lite, but it imports \""
                       ,*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                         pFVar2);
        std::operator+(&local_70,&local_50,"\" which is.");
        AddError(this,element_name,&proto->super_Message,IMPORT,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        break;
      }
    }
  }
  if (*(int *)(file + 0x3c) == 3) {
    ValidateProto3(this,file,proto);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateFileOptions(FileDescriptor* file,
                                            const FileDescriptorProto& proto) {
  VALIDATE_OPTIONS_FROM_ARRAY(file, message_type, Message);
  VALIDATE_OPTIONS_FROM_ARRAY(file, enum_type, Enum);
  VALIDATE_OPTIONS_FROM_ARRAY(file, service, Service);
  VALIDATE_OPTIONS_FROM_ARRAY(file, extension, Field);

  // Lite files can only be imported by other Lite files.
  if (!IsLite(file)) {
    for (int i = 0; i < file->dependency_count(); i++) {
      if (IsLite(file->dependency(i))) {
        AddError(
            file->dependency(i)->name(), proto,
            DescriptorPool::ErrorCollector::IMPORT,
            "Files that do not use optimize_for = LITE_RUNTIME cannot import "
            "files which do use this option.  This file is not lite, but it "
            "imports \"" +
                file->dependency(i)->name() + "\" which is.");
        break;
      }
    }
  }
  if (file->syntax() == FileDescriptor::SYNTAX_PROTO3) {
    ValidateProto3(file, proto);
  }
}